

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<tinyusdz::Payload> * __thiscall
tinyusdz::MetaVariable::get_value<tinyusdz::Payload>
          (optional<tinyusdz::Payload> *__return_storage_ptr__,MetaVariable *this)

{
  Payload *value;
  
  value = tinyusdz::value::Value::as<tinyusdz::Payload>(&this->_value,false);
  if (value == (Payload *)0x0) {
    __return_storage_ptr__->has_value_ = false;
    memset(&__return_storage_ptr__->contained,0,0x120);
  }
  else {
    nonstd::optional_lite::optional<tinyusdz::Payload>::optional<const_tinyusdz::Payload_&,_0>
              (__return_storage_ptr__,value);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    if (const T *v = _value.as<T>()) {
      return *v;
    }

    return nonstd::nullopt;
  }